

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

ssize_t __thiscall Kvm::read(Kvm *this,int __fd,void *__buf,size_t __nbytes)

{
  char c_00;
  bool bVar1;
  int iVar2;
  long *plVar3;
  Value *pVVar4;
  istream *piVar5;
  ostream *poVar6;
  KatException *pKVar7;
  uint uVar8;
  void *__buf_00;
  undefined4 in_register_00000034;
  Kvm *in;
  char cVar9;
  Kvm *this_00;
  long lVar10;
  long lStack_80;
  char c;
  allocator<char> local_71;
  GcGuard guard;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Value *result;
  ulong __nbytes_00;
  
  in = (Kvm *)CONCAT44(in_register_00000034,__fd);
  anon_unknown.dwarf_e6eb::eatWhitespace((istream *)in);
  std::operator>>((istream *)in,&c);
  if ((*(byte *)((long)&(in->interned_strings)._M_h._M_buckets[-3]->_M_nxt +
                (long)&(in->interned_strings)._M_h._M_rehash_policy._M_max_load_factor) & 5) != 0) {
    return 0;
  }
  if (c == 0x23) {
    this_00 = in;
    std::operator>>((istream *)in,&c);
    if (c == '\\') {
      pVVar4 = readCharacter(this_00,(istream *)in);
      return (ssize_t)pVVar4;
    }
    if (c != 'f') {
      if (c == 't') {
        return (ssize_t)this->TRUE;
      }
      pKVar7 = (KatException *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&guard,"unknown boolean literal",(allocator<char> *)&result);
      anon_unknown.dwarf_e6eb::KatException::KatException(pKVar7,(string *)&guard);
      __cxa_throw(pKVar7,&(anonymous_namespace)::KatException::typeinfo,
                  std::runtime_error::~runtime_error);
    }
    return (ssize_t)this->FALSE;
  }
  uVar8 = (int)c - 0x30;
  __nbytes_00 = (ulong)uVar8;
  cVar9 = (char)__fd;
  if (uVar8 < 10) {
    plVar3 = (long *)std::istream::putback(cVar9);
    __nbytes_00 = *(ulong *)(*plVar3 + -0x18);
    if ((*(byte *)((long)plVar3 + __nbytes_00 + 0x20) & 5) == 0) {
      lStack_80 = 2;
      goto LAB_0010b0d7;
    }
  }
  if ((c == '-') && (iVar2 = std::istream::peek(), iVar2 - 0x30U < 10)) {
    lStack_80 = -2;
LAB_0010b0d7:
    lVar10 = 0;
    while( true ) {
      piVar5 = std::operator>>((istream *)in,&c);
      if ((((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) ||
         (9 < (int)c - 0x30U)) break;
      lVar10 = (ulong)((int)c - 0x30U) + lVar10 * 10;
    }
    bVar1 = anon_unknown.dwarf_e6eb::isDelimiter(c);
    if (bVar1) {
      std::istream::putback(cVar9);
      return lStack_80 * lVar10 | 1;
    }
    pKVar7 = (KatException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&guard,"number not followed by delimiter",(allocator<char> *)&result);
    anon_unknown.dwarf_e6eb::KatException::KatException(pKVar7,(string *)&guard);
    __cxa_throw(pKVar7,&(anonymous_namespace)::KatException::typeinfo,
                std::runtime_error::~runtime_error);
  }
  if (c == '\"') {
    guard.gc_ = (Kgc *)&local_60;
    guard.times_ = 0;
    local_60._M_local_buf[0] = '\0';
    while ((piVar5 = std::operator>>((istream *)in,&c),
           ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0 && (c != '\"'))) {
      if (c == '\\') {
        piVar5 = std::operator>>((istream *)in,&c);
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
          pKVar7 = (KatException *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&result,"non-terminated string literal",&local_71);
          anon_unknown.dwarf_e6eb::KatException::KatException(pKVar7,(string *)&result);
          __cxa_throw(pKVar7,&(anonymous_namespace)::KatException::typeinfo,
                      std::runtime_error::~runtime_error);
        }
        if (c == 'n') {
          c = '\n';
        }
      }
      std::__cxx11::string::append((ulong)&guard,'\x01');
    }
    pVVar4 = makeString(this,(string *)&guard);
    std::__cxx11::string::~string((string *)&guard);
    return (ssize_t)pVVar4;
  }
  bVar1 = anon_unknown.dwarf_e6eb::isInitial(c);
  if (!bVar1) {
    if ((c == '-') || (c == '+')) {
      c_00 = std::istream::peek();
      bVar1 = anon_unknown.dwarf_e6eb::isDelimiter(c_00);
      if (bVar1) goto LAB_0010b022;
    }
    if (c == '\'') {
      result = (Value *)0x0;
      guard.gc_ = &this->gc_;
      guard.times_ = 0;
      GcGuard::pushLocalStackRoot(&guard,&result);
      result = (Value *)read(this,__fd,__buf_00,__nbytes_00);
      if (result == (Value *)0x0) {
        result = (Value *)0x0;
      }
      else {
        result = makeCell(this,result,this->NIL);
        result = makeCell(this,this->QUOTE,result);
      }
      pVVar4 = result;
      GcGuard::~GcGuard(&guard);
      return (ssize_t)pVVar4;
    }
    if (c == '(') {
      pVVar4 = readPair(this,(istream *)in);
      return (ssize_t)pVVar4;
    }
    guard.gc_ = (Kgc *)&local_60;
    guard.times_ = 0;
    local_60._M_local_buf[0] = '\0';
    std::__cxx11::string::append((char *)&guard);
    std::__cxx11::string::append((ulong)&guard,'\x01');
    std::__cxx11::string::append((char *)&guard);
    pKVar7 = (KatException *)__cxa_allocate_exception(0x10);
    anon_unknown.dwarf_e6eb::KatException::KatException(pKVar7,(string *)&guard);
    __cxa_throw(pKVar7,&(anonymous_namespace)::KatException::typeinfo,
                std::runtime_error::~runtime_error);
  }
LAB_0010b022:
  guard.gc_ = (Kgc *)&local_60;
  guard.times_ = 0;
  local_60._M_local_buf[0] = '\0';
  while( true ) {
    bVar1 = anon_unknown.dwarf_e6eb::isInitial(c);
    if ((((!bVar1) && (9 < (int)c - 0x30U)) && (c != '-')) && (c != '+')) break;
    std::__cxx11::string::append((ulong)&guard,'\x01');
    std::operator>>((istream *)in,&c);
  }
  bVar1 = anon_unknown.dwarf_e6eb::isDelimiter(c);
  if (bVar1) {
    std::istream::putback(cVar9);
    this = (Kvm *)makeSymbol(this,(string *)&guard);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"symbol not followed by delimiter. ");
    poVar6 = std::operator<<(poVar6,"Found \'");
    poVar6 = std::operator<<(poVar6,c);
    poVar6 = std::operator<<(poVar6,"\'");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::__cxx11::string::~string((string *)&guard);
  if (bVar1) {
    return (ssize_t)this;
  }
  pKVar7 = (KatException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&guard,"illegal read state",(allocator<char> *)&result);
  anon_unknown.dwarf_e6eb::KatException::KatException(pKVar7,(string *)&guard);
  __cxa_throw(pKVar7,&(anonymous_namespace)::KatException::typeinfo,
              std::runtime_error::~runtime_error);
}

Assistant:

const Value* Kvm::read(std::istream &in)
{
    eatWhitespace(in);

    int sign{1};
    long num{0};
    char c;
    in >> c;

    if (!in)
    {
        return nullptr;
    }
    if (c == '#') /* read a boolean */
    {
        in >> c;
        if (c == 't')
            return TRUE;
        else if (c == 'f')
            return FALSE;
        else if (c == '\\')
            return readCharacter(in);
        else
        {
            throw KatException("unknown boolean literal");
        }
    } else if ((isdigit(c) && in.putback(c)) ||
               (c == '-' && isdigit(in.peek()) && (sign = -1)))
    {
        /* read a fixnum */
        while (in >> c && isdigit(c))
        {
            num = num * 10 + (c - '0');
        }
        num *= sign;
        if (isDelimiter(c))
        {
            in.putback(c);
            return makeFixnum(num);
        } else
        {
            throw KatException("number not followed by delimiter");
        }
    } else if (c == '"')
    {
        string buffer;
        while (in >> c && c != '"')
        {
            if (c == '\\')
            {
                if (in >> c)
                {
                    if (c == 'n') c = '\n';
                } else
                {
                    throw KatException("non-terminated string literal");
                }
            }
            buffer.append(1, c);
        }
        return makeString(buffer);

    } else if (isInitial(c) || ((c == '+' || c == '-') && isDelimiter(in.peek()))) // FIXME: peek returns int
    {
        string symbol;
        while (isInitial(c) || isdigit(c) || c == '+' || c == '-')
        {
            symbol.append(1, c);
            in >> c;
        }
        if (isDelimiter(c))
        {
            in.putback(c);
            return makeSymbol(symbol);
        } else
        {
            cerr << "symbol not followed by delimiter. " <<
            "Found '" << c << "'" << endl;
        }
    } else if (c == '(')
    {
        return readPair(in);
    } else if (c == '\'')
    {
        const Value *result = nullptr;
        GcGuard guard{gc_};
        guard.pushLocalStackRoot(&result);
        result = read(in);
        if (!result) return nullptr;
        result = makeCell(result, NIL);
        result = makeCell(QUOTE, result);
        return result;
    } else
    {
        std::string msg;
        msg.append("bad input. unexpected '");
        msg.append(1, c);
        msg.append("'");
        throw KatException(msg);
    }
    throw KatException("illegal read state");
}